

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureWrapTests.cpp
# Opt level: O3

IterateResult __thiscall deqp::gles2::Functional::TextureWrapCase::iterate(TextureWrapCase *this)

{
  TestLog *pTVar1;
  pointer pbVar2;
  pointer pbVar3;
  RenderContext *pRVar4;
  int y;
  bool bVar5;
  int iVar6;
  deUint32 dVar7;
  uint uVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar10;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  char *description;
  byte bVar11;
  uint uVar12;
  void *data;
  uint uVar13;
  int width;
  RandomViewport viewport;
  vector<float,_std::allocator<float>_> texCoord;
  Surface renderedFrame;
  Surface referenceFrame;
  RandomViewport local_198;
  vector<float,_std::allocator<float>_> local_188;
  Texture2DView local_170;
  Surface local_160;
  uint local_144;
  uint local_140;
  uint local_13c;
  long local_138;
  Sampler local_130;
  TextureRenderer *local_f0;
  TestLog *local_e8;
  Surface local_e0;
  ReferenceParams local_c4;
  long lVar9;
  undefined4 extraout_var_01;
  
  iVar6 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar6);
  pTVar1 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  iVar6 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  dVar7 = deStringHash((this->super_TestCase).super_TestNode.m_name._M_dataplus._M_p);
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            (&local_198,(RenderTarget *)CONCAT44(extraout_var_00,iVar6),0x100,0x100,dVar7);
  tcu::Surface::Surface(&local_160,local_198.width,local_198.height);
  tcu::Surface::Surface(&local_e0,local_198.width,local_198.height);
  pbVar2 = (this->m_filenames).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar3 = (this->m_filenames).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  glu::TextureTestUtil::ReferenceParams::ReferenceParams(&local_c4,TEXTURETYPE_2D);
  local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (float *)0x0;
  local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_e8 = pTVar1;
  iVar6 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  lVar10 = CONCAT44(extraout_var_01,iVar6);
  bVar11 = 8 - *(char *)(lVar10 + 8);
  uVar8 = 0;
  if (0 < *(int *)(lVar10 + 0x14)) {
    uVar8 = 0x1000000 << (8U - (char)*(int *)(lVar10 + 0x14) & 0x1f);
  }
  uVar12 = 0x100 << (8U - *(char *)(lVar10 + 0xc) & 0x1f) | 1 << (bVar11 & 0x1f);
  uVar8 = 0x10000 << (8U - *(char *)(lVar10 + 0x10) & 0x1f) | uVar12 | uVar8;
  uVar13 = 0x7070707;
  if (pbVar2 == pbVar3) {
    uVar13 = 0x3030303;
  }
  local_13c = (uVar13 & 0xff) + (1 << (bVar11 & 0x1f) & 0xffU);
  if (0xfe < local_13c) {
    local_13c = 0xff;
  }
  local_140 = (uVar13 >> 8 & 0xff) + (uVar12 >> 8 & 0xff);
  if (0xfe < local_140) {
    local_140 = 0xff;
  }
  local_144 = (uVar13 >> 0x10 & 0xff) + (uVar8 >> 0x10 & 0xff);
  if (0xfe < local_144) {
    local_144 = 0xff;
  }
  uVar8 = (uVar13 >> 0x18) + (uVar8 >> 0x18);
  if (0xfe < uVar8) {
    uVar8 = 0xff;
  }
  (**(code **)(lVar9 + 8))(0x84c0);
  (**(code **)(lVar9 + 0xb8))(0xde1,this->m_texture->m_glTexture);
  (**(code **)(lVar9 + 0x1360))(0xde1,0x2802,this->m_wrapS);
  (**(code **)(lVar9 + 0x1360))(0xde1,0x2803,this->m_wrapT);
  (**(code **)(lVar9 + 0x1360))(0xde1,0x2801,this->m_minFilter);
  (**(code **)(lVar9 + 0x1360))(0xde1,0x2800,this->m_magFilter);
  dVar7 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar7,"Set texturing state",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureWrapTests.cpp"
                  ,0xb9);
  local_138 = lVar9;
  glu::mapGLSampler(&local_130,this->m_wrapS,this->m_wrapT,this->m_minFilter,this->m_magFilter);
  width = local_198.width / 2;
  local_c4.sampler.compareChannel = local_130.compareChannel;
  local_c4.sampler.magFilter = local_130.magFilter;
  local_c4.sampler.lodThreshold = local_130.lodThreshold;
  local_c4.sampler.normalizedCoords = local_130.normalizedCoords;
  local_c4.sampler._25_3_ = local_130._25_3_;
  local_c4.sampler.compare = local_130.compare;
  local_c4.sampler.wrapS = local_130.wrapS;
  local_c4.sampler.wrapT = local_130.wrapT;
  local_c4.sampler.wrapR = local_130.wrapR;
  local_c4.sampler.minFilter = local_130.minFilter;
  local_c4.sampler.borderColor.v.uData[0] = local_130.borderColor.v.uData[0];
  local_c4.sampler.borderColor.v.uData[1] = local_130.borderColor.v.uData[1];
  local_c4.sampler.borderColor.v.uData[2] = local_130.borderColor.v.uData[2];
  local_c4.sampler.borderColor.v.uData[3] = local_130.borderColor.v.uData[3];
  local_c4.sampler.seamlessCubeMap = local_130.seamlessCubeMap;
  local_c4.sampler._53_3_ = local_130._53_3_;
  local_c4.sampler.depthStencilMode = local_130.depthStencilMode;
  local_c4.lodMode = LODMODE_EXACT;
  (**(code **)(local_138 + 0x1a00))(local_198.x,local_198.y,width,local_198.height);
  local_130.wrapS = 0xbfc00000;
  local_130.wrapT = 0xc0400000;
  local_170.m_numLevels = 0x3fc00000;
  local_170._4_4_ = 0x40200000;
  glu::TextureTestUtil::computeQuadTexCoord2D(&local_188,(Vec2 *)&local_130,(Vec2 *)&local_170);
  local_f0 = &this->m_renderer;
  deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
            (local_f0,0,
             local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start,&local_c4.super_RenderParams);
  y = local_198.y;
  iVar6 = local_198.x;
  pRVar4 = this->m_renderCtx;
  local_170.m_numLevels = 8;
  local_170._4_4_ = 3;
  data = (void *)local_160.m_pixels.m_cap;
  if ((void *)local_160.m_pixels.m_cap != (void *)0x0) {
    data = local_160.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)&local_130,(TextureFormat *)&local_170,local_160.m_width,
             local_160.m_height,1,data);
  glu::readPixels(pRVar4,iVar6,y,(PixelBufferAccess *)&local_130);
  iVar6 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  tcu::SurfaceAccess::SurfaceAccess
            ((SurfaceAccess *)&local_130,&local_e0,
             (PixelFormat *)(CONCAT44(extraout_var_02,iVar6) + 8),0,0,width,local_198.height);
  local_170.m_levels = (this->m_texture->m_refTexture).m_view.m_levels;
  local_170.m_numLevels = (this->m_texture->m_refTexture).m_view.m_numLevels;
  glu::TextureTestUtil::sampleTexture
            ((SurfaceAccess *)&local_130,&local_170,
             local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start,&local_c4);
  (**(code **)(local_138 + 0x1a00))
            (local_198.x + width,local_198.y,local_198.width - width,local_198.height);
  local_130.wrapS = 0xbf000000;
  local_130.wrapT = 0x3f400000;
  local_170.m_numLevels = 0x3e800000;
  local_170._4_4_ = 0x3fa00000;
  glu::TextureTestUtil::computeQuadTexCoord2D(&local_188,(Vec2 *)&local_130,(Vec2 *)&local_170);
  deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
            (local_f0,0,
             local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start,&local_c4.super_RenderParams);
  pRVar4 = this->m_renderCtx;
  local_170.m_numLevels = 8;
  local_170._4_4_ = 3;
  if ((void *)local_160.m_pixels.m_cap != (void *)0x0) {
    local_160.m_pixels.m_cap = (size_t)local_160.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)&local_130,(TextureFormat *)&local_170,local_160.m_width,
             local_160.m_height,1,(void *)local_160.m_pixels.m_cap);
  glu::readPixels(pRVar4,local_198.x,local_198.y,(PixelBufferAccess *)&local_130);
  iVar6 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  tcu::SurfaceAccess::SurfaceAccess
            ((SurfaceAccess *)&local_130,&local_e0,
             (PixelFormat *)(CONCAT44(extraout_var_03,iVar6) + 8),width,0,local_198.width - width,
             local_198.height);
  local_170.m_levels = (this->m_texture->m_refTexture).m_view.m_levels;
  local_170.m_numLevels = (this->m_texture->m_refTexture).m_view.m_numLevels;
  glu::TextureTestUtil::sampleTexture
            ((SurfaceAccess *)&local_130,&local_170,
             local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start,&local_c4);
  bVar5 = glu::TextureTestUtil::compareImages
                    (local_e8,&local_e0,&local_160,
                     (RGBA)(local_144 << 0x10 | uVar8 << 0x18 | local_140 << 8 | local_13c));
  description = "Image comparison failed";
  if (bVar5) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestNode.m_testCtx,(uint)!bVar5,description);
  if (local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (float *)0x0) {
    operator_delete(local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  tcu::Surface::~Surface(&local_e0);
  tcu::Surface::~Surface(&local_160);
  return STOP;
}

Assistant:

TextureWrapCase::IterateResult TextureWrapCase::iterate (void)
{
	const glw::Functions&	gl					= m_renderCtx.getFunctions();
	TestLog&				log					= m_testCtx.getLog();
	RandomViewport			viewport			(m_renderCtx.getRenderTarget(), VIEWPORT_WIDTH, VIEWPORT_HEIGHT, deStringHash(getName()));
	tcu::Surface			renderedFrame		(viewport.width, viewport.height);
	tcu::Surface			referenceFrame		(viewport.width, viewport.height);
	bool					isCompressedTex		= !m_filenames.empty();
	ReferenceParams			refParams			(TEXTURETYPE_2D);
	int						leftWidth			= viewport.width / 2;
	int						rightWidth			= viewport.width - leftWidth;
	vector<float>			texCoord;
	tcu::RGBA				threshold			= m_renderCtx.getRenderTarget().getPixelFormat().getColorThreshold()
												+ (isCompressedTex ? tcu::RGBA(7,7,7,7) : tcu::RGBA(3,3,3,3));

	// Bind to unit 0.
	gl.activeTexture(GL_TEXTURE0);
	gl.bindTexture(GL_TEXTURE_2D, m_texture->getGLTexture());

	// Setup filtering and wrap modes.
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S,		m_wrapS);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T,		m_wrapT);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER,	m_minFilter);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER,	m_magFilter);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Set texturing state");

	// Parameters for reference images.
	refParams.sampler	= mapGLSampler(m_wrapS, m_wrapT, m_minFilter, m_magFilter);
	refParams.lodMode	= LODMODE_EXACT;

	// Left: minification
	{
		gl.viewport(viewport.x, viewport.y, leftWidth, viewport.height);

		computeQuadTexCoord2D(texCoord, tcu::Vec2(-1.5f, -3.0f), tcu::Vec2(1.5f, 2.5f));

		m_renderer.renderQuad(0, &texCoord[0], refParams);
		glu::readPixels(m_renderCtx, viewport.x, viewport.y, renderedFrame.getAccess());

		sampleTexture(tcu::SurfaceAccess(referenceFrame, m_renderCtx.getRenderTarget().getPixelFormat(), 0, 0, leftWidth, viewport.height),
					  m_texture->getRefTexture(), &texCoord[0], refParams);
	}

	// Right: magnification
	{
		gl.viewport(viewport.x+leftWidth, viewport.y, rightWidth, viewport.height);

		computeQuadTexCoord2D(texCoord, tcu::Vec2(-0.5f, 0.75f), tcu::Vec2(0.25f, 1.25f));

		m_renderer.renderQuad(0, &texCoord[0], refParams);
		glu::readPixels(m_renderCtx, viewport.x, viewport.y, renderedFrame.getAccess());

		sampleTexture(tcu::SurfaceAccess(referenceFrame, m_renderCtx.getRenderTarget().getPixelFormat(), leftWidth, 0, rightWidth, viewport.height),
					  m_texture->getRefTexture(), &texCoord[0], refParams);
	}

	// Compare and log.
	bool isOk = compareImages(log, referenceFrame, renderedFrame, threshold);

	m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
							isOk ? "Pass"				: "Image comparison failed");

	return STOP;
}